

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Gridded_Data_PDU::Gridded_Data_PDU
          (Gridded_Data_PDU *this,EntityIdentifier *EnvironmentalProcessID,KUINT16 FieldNumber,
          KUINT16 PduNum,KUINT16 PduTotal,CoordinateSystem CS,ConstantGrid CG,EnvironmentType *ET,
          EulerAngles *Ori,KUINT64 SampleTime)

{
  KUINT16 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  KFLOAT32 KVar7;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Gridded_Data_PDU_002232b0;
  (this->m_EnvProcID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223f60;
  KVar1 = (EnvironmentalProcessID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EnvProcID).super_SimulationIdentifier.m_ui16SiteID =
       (EnvironmentalProcessID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EnvProcID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_EnvProcID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00223c00;
  *(undefined2 *)&(this->m_EnvProcID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(EnvironmentalProcessID->super_SimulationIdentifier).field_0xc;
  this->m_ui16FieldNum = FieldNumber;
  this->m_ui16PDUNum = PduNum;
  this->m_ui16PDUTotal = PduTotal;
  this->m_ui16CordSys = (KUINT16)CS;
  this->m_ui8NumAxis = '\0';
  this->m_ui8ConstGrid = (undefined1)CG;
  (this->m_EnvType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EnvironmentType_002245a8;
  KVar2 = ET->m_ui8Domain;
  KVar1 = ET->m_ui16Class;
  KVar3 = ET->m_ui8Category;
  KVar4 = ET->m_ui8SubCategory;
  KVar5 = ET->m_ui8Specific;
  KVar6 = ET->m_ui8Extra;
  (this->m_EnvType).m_ui8EntityKind = ET->m_ui8EntityKind;
  (this->m_EnvType).m_ui8Domain = KVar2;
  (this->m_EnvType).m_ui16Class = KVar1;
  (this->m_EnvType).m_ui8Category = KVar3;
  (this->m_EnvType).m_ui8SubCategory = KVar4;
  (this->m_EnvType).m_ui8Specific = KVar5;
  (this->m_EnvType).m_ui8Extra = KVar6;
  (this->m_Ori).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_00223d08;
  KVar7 = Ori->m_f32Theta;
  (this->m_Ori).m_f32Psi = Ori->m_f32Psi;
  (this->m_Ori).m_f32Theta = KVar7;
  (this->m_Ori).m_f32Phi = Ori->m_f32Phi;
  this->m_ui64SampleTime = SampleTime;
  this->m_ui32TotalValues = 0;
  this->m_ui8VecDim = '\0';
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding1 = '\0';
  (this->m_vpGridAxisDesc).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpGridAxisDesc).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vpGridAxisDesc).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vGridData).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vGridData).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vGridData).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = '*';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\t';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x40;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Gridded_Data_PDU::Gridded_Data_PDU( const EntityIdentifier & EnvironmentalProcessID, KUINT16 FieldNumber, KUINT16 PduNum,
                                    KUINT16 PduTotal, CoordinateSystem CS, ConstantGrid CG, const EnvironmentType & ET,
                                    const EulerAngles & Ori, KUINT64 SampleTime ) :
    m_EnvProcID( EnvironmentalProcessID ),
    m_ui16FieldNum( FieldNumber ),
    m_ui16PDUNum( PduNum ),
    m_ui16PDUTotal( PduTotal ),
    m_ui16CordSys( CS ),
    m_ui8NumAxis( 0 ),
    m_ui8ConstGrid( CG ),
    m_EnvType( ET ),
    m_Ori( Ori ),
    m_ui64SampleTime( SampleTime ),
    m_ui32TotalValues( 0 ),
    m_ui8VecDim( 0 ),
    m_ui16Padding1( 0 ),
    m_ui8Padding1( 0 )
{
    m_ui8ProtocolFamily = SyntheticEnvironment;
    m_ui8PDUType = GriddedData_PDU_Type;
    m_ui16PDULength = GRIDDED_DATA_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}